

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O0

string * __thiscall GraphNode::dotGraph_abi_cxx11_(string *__return_storage_ptr__,GraphNode *this)

{
  bool bVar1;
  __weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  shared_ptr<GraphNode> pointer;
  const_iterator local_90;
  weak_ptr<GraphNode> *local_88;
  __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
  local_80;
  __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
  local_78;
  iterator iter;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  GraphNode *local_18;
  GraphNode *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (GraphNode *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_60,this->m_value);
  std::operator+(&local_40,"\t",&local_60);
  std::operator+(__return_storage_ptr__,&local_40,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_78._M_current =
       (weak_ptr<GraphNode> *)
       std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::begin
                 (&this->m_pointers);
  while( true ) {
    local_80._M_current =
         (weak_ptr<GraphNode> *)
         std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::end
                   (&this->m_pointers);
    bVar1 = __gnu_cxx::operator!=(&local_78,&local_80);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
               ::operator->(&local_78)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>;
    bVar1 = std::__weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>::expired(this_00);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<GraphNode>const*,std::vector<std::weak_ptr<GraphNode>,std::allocator<std::weak_ptr<GraphNode>>>>
      ::__normal_iterator<std::weak_ptr<GraphNode>*>
                ((__normal_iterator<std::weak_ptr<GraphNode>const*,std::vector<std::weak_ptr<GraphNode>,std::allocator<std::weak_ptr<GraphNode>>>>
                  *)&local_90,&local_78);
      local_88 = (weak_ptr<GraphNode> *)
                 std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
                 erase(&this->m_pointers,local_90);
      local_78._M_current = local_88;
      pointer.super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
           ::operator--(&local_78,0);
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
      ::operator->(&local_78);
      std::weak_ptr<GraphNode>::lock((weak_ptr<GraphNode> *)local_a8);
      std::__cxx11::to_string(&local_148,this->m_value);
      std::operator+(&local_128,"\t",&local_148);
      std::operator+(&local_108,&local_128,"->");
      peVar2 = std::__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<GraphNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
      std::__cxx11::to_string(&local_168,peVar2->m_value);
      std::operator+(&local_e8,&local_108,&local_168);
      std::operator+(&local_c8,&local_e8,"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::shared_ptr<GraphNode>::~shared_ptr((shared_ptr<GraphNode> *)local_a8);
    }
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
    ::operator++(&local_78,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GraphNode::dotGraph() {
    std::string result = "\t" + std::to_string(m_value) + "\n";
    for (auto iter = m_pointers.begin(); iter != m_pointers.end(); iter++)
        if (iter->expired()) {
            iter = m_pointers.erase(iter);
            iter--;
        } else {
            auto pointer = iter->lock();
            result += "\t" + std::to_string(m_value) + "->" + std::to_string(pointer->m_value) + "\n";
        }

    return result;
}